

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

void __thiscall Memory::HeapInfo::DisposeObjects(HeapInfo *this)

{
  Recycler *this_00;
  BOOL BVar1;
  uint local_20;
  uint local_1c;
  uint i_1;
  uint i;
  Recycler *recycler;
  HeapInfo *this_local;
  
  this_00 = this->recycler;
  do {
    this_00->hasDisposableObject = false;
    for (local_1c = 0; local_1c < 0x30; local_1c = local_1c + 1) {
      HeapBucketGroup<SmallAllocationBlockAttributes>::DisposeObjects(this->heapBuckets + local_1c);
    }
    for (local_20 = 0; local_20 < 0x1d; local_20 = local_20 + 1) {
      HeapBucketGroup<MediumAllocationBlockAttributes>::DisposeObjects
                (this->mediumHeapBuckets + local_20);
    }
    LargeHeapBucket::DisposeObjects(&this->largeObjectBucket);
  } while ((this_00->hasDisposableObject & 1U) != 0);
  this->hasPendingTransferDisposedObjects = true;
  BVar1 = Recycler::IsConcurrentExecutingState(this_00);
  if (BVar1 == 0) {
    TransferDisposedObjects(this);
  }
  return;
}

Assistant:

void
HeapInfo::DisposeObjects()
{
    Recycler * recycler = this->recycler;
    do
    {
        recycler->hasDisposableObject = false;

        // finalizing the objects
        for (uint i = 0; i < HeapConstants::BucketCount; i++)
        {
            heapBuckets[i].DisposeObjects();
        }

#ifdef BUCKETIZE_MEDIUM_ALLOCATIONS
        for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
        {
            mediumHeapBuckets[i].DisposeObjects();
        }
#endif

        largeObjectBucket.DisposeObjects();
    }
    // Calling dispose may enter the GC again and dispose more objects, loop until we don't have any more
    while (recycler->hasDisposableObject);

    this->hasPendingTransferDisposedObjects = true;
#if ENABLE_CONCURRENT_GC
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP 
    // As during concurrent sweep we start/stop allocations it is safer to prevent transferring disposed objects altogether.
    if (!recycler->IsConcurrentExecutingState() && !recycler->IsConcurrentSweepState())
#else
    if (!recycler->IsConcurrentExecutingState())
#endif
#endif
    {
        // Can't transfer disposed object when the background thread is walking the heap block list
        // That includes reset mark, background rescan and concurrent sweep. Delay the transfer later.
        // NOTE1: During concurrent sweep,  we can't do this only if the bucket has "stopped" allocation
        // After it resume allocation, we don't walk the list in the background thread any more
        // (except for checking heap block count). But this is easier to detect via the collection state
        // without walking all buckets.
        // NOTE2: During transitive closure mark, we don't walk the heap block list, but we can continue
        // to do background rescan.  Since we don't have synchronization for that, we can't really enable
        // able this just for the transitive closure,  so just do all the background executing state.
        TransferDisposedObjects();
    }
}